

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O2

unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
createColorPrimaries(khr_df_primaries_e primaries)

{
  __uniq_ptr_impl<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_> _Var1;
  _Head_base<0UL,_ColorPrimariesBT709_*,_false> in_RAX;
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true> _Var2
  ;
  __uniq_ptr_impl<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_> local_18;
  
  _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t
  .super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t
  .super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl._0_4_ = primaries;
  local_18._M_t.
  super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
  super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
       (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
       (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)in_RAX._M_head_impl;
  switch(in_ESI) {
  case 1:
    std::make_unique<ColorPrimariesBT709>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesBT709,_std::default_delete<ColorPrimariesBT709>_> *)
               &local_18);
    break;
  case 2:
    std::make_unique<ColorPrimariesBT601_625_EBU>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesBT601_625_EBU,_std::default_delete<ColorPrimariesBT601_625_EBU>_>
    ::~unique_ptr((unique_ptr<ColorPrimariesBT601_625_EBU,_std::default_delete<ColorPrimariesBT601_625_EBU>_>
                   *)&local_18);
    break;
  case 3:
    std::make_unique<ColorPrimariesBT601_525_SMPTE>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::
    unique_ptr<ColorPrimariesBT601_525_SMPTE,_std::default_delete<ColorPrimariesBT601_525_SMPTE>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesBT601_525_SMPTE,_std::default_delete<ColorPrimariesBT601_525_SMPTE>_>
                 *)&local_18);
    break;
  case 4:
    std::make_unique<ColorPrimariesBT2020>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesBT2020,_std::default_delete<ColorPrimariesBT2020>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesBT2020,_std::default_delete<ColorPrimariesBT2020>_> *)
               &local_18);
    break;
  case 5:
    std::make_unique<ColorPrimariesCIEXYZ>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesCIEXYZ,_std::default_delete<ColorPrimariesCIEXYZ>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesCIEXYZ,_std::default_delete<ColorPrimariesCIEXYZ>_> *)
               &local_18);
    break;
  case 6:
    std::make_unique<ColorPrimariesACES>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesACES,_std::default_delete<ColorPrimariesACES>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesACES,_std::default_delete<ColorPrimariesACES>_> *)&local_18
              );
    break;
  case 7:
    std::make_unique<ColorPrimariesACEScc>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesACEScc,_std::default_delete<ColorPrimariesACEScc>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesACEScc,_std::default_delete<ColorPrimariesACEScc>_> *)
               &local_18);
    break;
  case 8:
    std::make_unique<ColorPrimariesNTSC1953>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesNTSC1953,_std::default_delete<ColorPrimariesNTSC1953>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesNTSC1953,_std::default_delete<ColorPrimariesNTSC1953>_> *)
                &local_18);
    break;
  case 9:
    std::make_unique<ColorPrimariesPAL525>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesPAL525,_std::default_delete<ColorPrimariesPAL525>_>::~unique_ptr
              ((unique_ptr<ColorPrimariesPAL525,_std::default_delete<ColorPrimariesPAL525>_> *)
               &local_18);
    break;
  case 10:
    std::make_unique<ColorPrimariesDisplayP3>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesDisplayP3,_std::default_delete<ColorPrimariesDisplayP3>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesDisplayP3,_std::default_delete<ColorPrimariesDisplayP3>_>
                 *)&local_18);
    break;
  case 0xb:
    std::make_unique<ColorPrimariesAdobeRGB>();
    _Var1._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         local_18._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    local_18._M_t.
    super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
    super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl =
         (tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)
         (_Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>)0x0;
    *(tuple<ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_> *)
     _Var2.super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
     _M_t.super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
     .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
         _Var1._M_t.
         super__Tuple_impl<0UL,_ColorPrimariesBT709_*,_std::default_delete<ColorPrimariesBT709>_>.
         super__Head_base<0UL,_ColorPrimariesBT709_*,_false>._M_head_impl;
    std::unique_ptr<ColorPrimariesAdobeRGB,_std::default_delete<ColorPrimariesAdobeRGB>_>::
    ~unique_ptr((unique_ptr<ColorPrimariesAdobeRGB,_std::default_delete<ColorPrimariesAdobeRGB>_> *)
                &local_18);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x5ac,
                  "std::unique_ptr<const ColorPrimaries> createColorPrimaries(khr_df_primaries_e)");
  }
  return (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
          )(tuple<const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>)
           _Var2.
           super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>.
           _M_t.
           super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
           .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<const ColorPrimaries>
createColorPrimaries(khr_df_primaries_e primaries) {
    switch (primaries) {
    case KHR_DF_PRIMARIES_BT709:
        return std::make_unique<ColorPrimariesBT709>();
    case KHR_DF_PRIMARIES_BT601_EBU:
        return std::make_unique<ColorPrimariesBT601_625_EBU>();
    case KHR_DF_PRIMARIES_BT601_SMPTE:
        return std::make_unique<ColorPrimariesBT601_525_SMPTE>();
    case KHR_DF_PRIMARIES_BT2020:
        return std::make_unique<ColorPrimariesBT2020>();
    case KHR_DF_PRIMARIES_CIEXYZ:
        return std::make_unique<ColorPrimariesCIEXYZ>();
    case KHR_DF_PRIMARIES_ACES:
        return std::make_unique<ColorPrimariesACES>();
    case KHR_DF_PRIMARIES_ACESCC:
        return std::make_unique<ColorPrimariesACEScc>();
    case KHR_DF_PRIMARIES_NTSC1953:
        return std::make_unique<ColorPrimariesNTSC1953>();
    case KHR_DF_PRIMARIES_PAL525:
        return std::make_unique<ColorPrimariesPAL525>();
    case KHR_DF_PRIMARIES_DISPLAYP3:
        return std::make_unique<ColorPrimariesDisplayP3>();
    case KHR_DF_PRIMARIES_ADOBERGB:
        return std::make_unique<ColorPrimariesAdobeRGB>();
    default:
        assert(false);
        // We return BT709 by default if some error happened
        return std::make_unique<ColorPrimariesBT709>();
    }
}